

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

void clear_given(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->input_given = 0;
  args_info->output_given = 0;
  args_info->sele1_given = 0;
  args_info->sele2_given = 0;
  args_info->nbins_given = 0;
  args_info->nbins_z_given = 0;
  args_info->privilegedAxis_given = 0;
  args_info->centroidX_given = 0;
  args_info->centroidY_given = 0;
  args_info->referenceZ_given = 0;
  args_info->dropletR_given = 0;
  args_info->threshDens_given = 0;
  args_info->bufferLength_given = 0;
  args_info->rcut_given = 0;
  args_info->com_given = 0;
  args_info->comvel_given = 0;
  args_info->deltaCount_given = 0;
  args_info->fluxOut_given = 0;
  args_info->ca1_given = 0;
  args_info->ca2_given = 0;
  args_info->gcn_given = 0;
  args_info->testequi_given = 0;
  args_info->sequentialProps_group_counter = 0;
  return;
}

Assistant:

static
void clear_given (struct gengetopt_args_info *args_info)
{
  args_info->help_given = 0 ;
  args_info->version_given = 0 ;
  args_info->input_given = 0 ;
  args_info->output_given = 0 ;
  args_info->sele1_given = 0 ;
  args_info->sele2_given = 0 ;
  args_info->nbins_given = 0 ;
  args_info->nbins_z_given = 0 ;
  args_info->privilegedAxis_given = 0 ;
  args_info->centroidX_given = 0 ;
  args_info->centroidY_given = 0 ;
  args_info->referenceZ_given = 0 ;
  args_info->dropletR_given = 0 ;
  args_info->threshDens_given = 0 ;
  args_info->bufferLength_given = 0 ;
  args_info->rcut_given = 0 ;
  args_info->com_given = 0 ;
  args_info->comvel_given = 0 ;
  args_info->deltaCount_given = 0 ;
  args_info->fluxOut_given = 0 ;
  args_info->ca1_given = 0 ;
  args_info->ca2_given = 0 ;
  args_info->gcn_given = 0 ;
  args_info->testequi_given = 0 ;
  args_info->sequentialProps_group_counter = 0 ;
}